

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

void __thiscall
Lib::
DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
expand(DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
       *this)

{
  uint uVar1;
  undefined8 uVar2;
  Entry *pEVar3;
  pair<unsigned_int,_unsigned_int> val;
  uint *in_RDI;
  Entry *ep;
  int oldCapacity;
  uint oldTimestamp;
  Entry *oldAfterLast;
  Entry *oldEntries;
  void *mem;
  int newCapacity;
  size_t in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  uint uVar4;
  uint uVar5;
  pair<unsigned_int,_unsigned_int> key;
  char *in_stack_ffffffffffffffd8;
  pair<unsigned_int,_unsigned_int> __ptr;
  Exception *in_stack_ffffffffffffffe0;
  
  if (0x1c < (int)in_RDI[3]) {
    uVar2 = __cxa_allocate_exception(0x28);
    Lib::Exception::Exception(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    __cxa_throw(uVar2,&Lib::Exception::typeinfo,Lib::Exception::~Exception);
  }
  uVar1 = *(uint *)(DHMapTableCapacities + (long)(int)(in_RDI[3] + 1) * 4);
  Lib::alloc((size_t)in_RDI);
  val = *(pair<unsigned_int,_unsigned_int> *)(in_RDI + 6);
  key = *(pair<unsigned_int,_unsigned_int> *)(in_RDI + 8);
  uVar5 = *in_RDI;
  uVar4 = in_RDI[4];
  *in_RDI = 1;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = in_RDI[3] + 1;
  in_RDI[4] = uVar1;
  in_RDI[5] = *(uint *)(DHMapTableNextExpansions + (long)(int)in_RDI[3] * 4);
  pEVar3 = array_new<Lib::DHMap<std::pair<unsigned_int,unsigned_int>,Kernel::Term*,Lib::DefaultHash,Lib::DefaultHash2>::Entry>
                     (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *(Entry **)(in_RDI + 6) = pEVar3;
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 6) + (long)(int)in_RDI[4] * 0x18;
  __ptr = val;
  for (; val != key; val = (pair<unsigned_int,_unsigned_int>)((long)val + 0x18)) {
    if ((*(uint *)val >> 2 == uVar5) && ((*(uint *)val & 1) == 0)) {
      insert((DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)CONCAT44(uVar5,uVar4),key,(Term *)val);
    }
  }
  if (uVar4 != 0) {
    Lib::free((void *)__ptr);
  }
  return;
}

Assistant:

void expand()
  {
    if(_capacityIndex>=DHMAP_MAX_CAPACITY_INDEX) {
      throw Exception("Lib::DHMap::expand: MaxCapacityIndex reached.");
    }

    int newCapacity=DHMapTableCapacities[_capacityIndex+1];
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(Entry),"DHMap::Entry");


    Entry* oldEntries=_entries;
    Entry* oldAfterLast=_afterLast;
    unsigned oldTimestamp=_timestamp;
    int oldCapacity=_capacity;

    _timestamp=1;
    _size=0;
    _deleted=0;
    _capacityIndex++;
    _capacity = newCapacity;
    _nextExpansionOccupancy = DHMapTableNextExpansions[_capacityIndex];

    _entries = array_new<Entry>(mem, _capacity);
    _afterLast = _entries + _capacity;

    Entry* ep=oldEntries;
    while(ep!=oldAfterLast) {
      ASS(ep);
      if(ep->_info.timestamp==oldTimestamp && !ep->_info.deleted) {
	insert(std::move(ep->_key), std::move(ep->_val));
      }
      (ep++)->~Entry();
    }
    if(oldCapacity) {
      DEALLOC_KNOWN(oldEntries,oldCapacity*sizeof(Entry),"DHMap::Entry");
    }
  }